

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

WordTagger * __thiscall CoreML::Specification::Model::mutable_wordtagger(Model *this)

{
  bool bVar1;
  WordTagger *this_00;
  Model *this_local;
  
  bVar1 = has_wordtagger(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_wordtagger(this);
    this_00 = (WordTagger *)operator_new(0x58);
    CoreMLModels::WordTagger::WordTagger(this_00);
    (this->Type_).wordtagger_ = this_00;
  }
  return (WordTagger *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::WordTagger* Model::mutable_wordtagger() {
  if (!has_wordtagger()) {
    clear_Type();
    set_has_wordtagger();
    Type_.wordtagger_ = new ::CoreML::Specification::CoreMLModels::WordTagger;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.wordTagger)
  return Type_.wordtagger_;
}